

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void __thiscall SBarInfoCommandFlowControl::Reset(SBarInfoCommandFlowControl *this)

{
  SBarInfoCommand **ppSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar3 = 0;
  do {
    uVar4 = (ulong)this->commands[lVar3].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    if (uVar4 != 0) {
      ppSVar1 = this->commands[lVar3].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
      lVar2 = 0;
      do {
        (**(code **)(**(long **)((long)ppSVar1 + lVar2) + 0x20))();
        lVar2 = lVar2 + 8;
      } while (uVar4 << 3 != lVar2);
    }
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  return;
}

Assistant:

void	Reset()
		{
			for(unsigned int i = 0;i < 2;i++)
			{
				for(auto command : commands[i])
					command->Reset();
			}
		}